

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O1

int __thiscall
QMimeBinaryProvider::matchGlobList
          (QMimeBinaryProvider *this,QMimeGlobMatchResult *result,CacheFile *cacheFile,int off,
          QString *fileName)

{
  long lVar1;
  uchar *puVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  bool bVar6;
  uint uVar7;
  QString *pQVar8;
  uchar *puVar9;
  storage_type *psVar10;
  uchar *puVar11;
  QString *pQVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QMimeGlobPattern glob;
  int local_104;
  QString local_d8;
  QString local_b8;
  QString local_98;
  undefined1 local_78 [56];
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = *(uint *)(cacheFile->data + off);
  uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
  if ((int)uVar7 < 1) {
    local_104 = 0;
  }
  else {
    uVar13 = 0;
    local_104 = 0;
    do {
      lVar1 = (long)(off + 4) + uVar13 * 0xc;
      puVar9 = cacheFile->data;
      uVar3 = *(uint *)(puVar9 + lVar1);
      uVar4 = *(uint *)(puVar9 + lVar1 + 4);
      uVar5 = *(uint *)(puVar9 + lVar1 + 8);
      ba.m_size = puVar9 + (int)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                                uVar3 << 0x18);
      local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
      if (puVar9 == (uchar *)0x0) {
        pQVar12 = (QString *)0x0;
      }
      else {
        pQVar8 = (QString *)0xffffffffffffffff;
        do {
          pQVar12 = (QString *)((long)&(pQVar8->d).d + 1);
          puVar11 = ba.m_size + 1 + (long)pQVar8;
          pQVar8 = pQVar12;
        } while (*puVar11 != '\0');
      }
      ba.m_data = (storage_type *)puVar9;
      QString::fromLatin1((QString *)local_78,pQVar12,ba);
      local_b8.d.d = (Data *)local_78._0_8_;
      local_b8.d.ptr = (char16_t *)local_78._8_8_;
      local_b8.d.size = local_78._16_8_;
      puVar11 = cacheFile->data +
                (int)(uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 |
                     uVar4 << 0x18);
      if (cacheFile->data == (uchar *)0x0) {
        pQVar12 = (QString *)0x0;
      }
      else {
        pQVar8 = (QString *)0xffffffffffffffff;
        do {
          pQVar12 = (QString *)((long)&(pQVar8->d).d + 1);
          puVar2 = puVar11 + 1 + (long)pQVar8;
          pQVar8 = pQVar12;
        } while (*puVar2 != '\0');
      }
      ba_00.m_data = (storage_type *)puVar9;
      ba_00.m_size = (qsizetype)puVar11;
      QString::fromLatin1((QString *)local_78,pQVar12,ba_00);
      local_98.d.d = (Data *)local_78._0_8_;
      local_98.d.ptr = (char16_t *)local_78._8_8_;
      local_98.d.size = local_78._16_8_;
      bVar6 = QMimeProviderBase::isMimeTypeGlobsExcluded(&this->super_QMimeProviderBase,&local_98);
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (!bVar6) {
        uVar3 = uVar5 >> 0x18;
        local_78._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_78._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_98.d.d = (Data *)0x0;
        local_98.d.ptr = (char16_t *)0x0;
        local_98.d.size = 0;
        psVar10 = (storage_type *)(ulong)uVar3;
        QMimeGlobPattern::QMimeGlobPattern
                  ((QMimeGlobPattern *)local_78,&local_b8,&local_98,uVar3,
                   ((uVar5 & 0xff0000) >> 8 & 0x100) >> 8);
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
          }
        }
        bVar6 = QMimeGlobPattern::matchFileName((QMimeGlobPattern *)local_78,fileName);
        if (bVar6) {
          ba_01.m_data = psVar10;
          ba_01.m_size = (qsizetype)puVar11;
          QString::fromLatin1(&local_98,pQVar12,ba_01);
          local_d8.d.d = local_98.d.d;
          local_d8.d.ptr = local_98.d.ptr;
          local_d8.d.size = local_98.d.size;
          QMimeGlobMatchResult::addMatch(result,&local_d8,uVar3,&local_b8,0);
          if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
            }
          }
          local_104 = local_104 + 1;
        }
        if ((QArrayData *)local_78._24_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_78._24_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_78._24_8_,2,0x10);
          }
        }
        if ((QArrayData *)local_78._0_8_ != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_78._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_78._0_8_,2,0x10);
          }
        }
      }
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_104;
}

Assistant:

int QMimeBinaryProvider::matchGlobList(QMimeGlobMatchResult &result, CacheFile *cacheFile, int off,
                                       const QString &fileName)
{
    int numMatches = 0;
    const int numGlobs = cacheFile->getUint32(off);
    //qDebug() << "Loading" << numGlobs << "globs from" << cacheFile->file.fileName() << "at offset" << cacheFile->globListOffset;
    for (int i = 0; i < numGlobs; ++i) {
        const int globOffset = cacheFile->getUint32(off + 4 + 12 * i);
        const int mimeTypeOffset = cacheFile->getUint32(off + 4 + 12 * i + 4);
        const int flagsAndWeight = cacheFile->getUint32(off + 4 + 12 * i + 8);
        const int weight = flagsAndWeight & 0xff;
        const bool caseSensitive = flagsAndWeight & 0x100;
        const Qt::CaseSensitivity qtCaseSensitive = caseSensitive ? Qt::CaseSensitive : Qt::CaseInsensitive;
        const QString pattern = QLatin1StringView(cacheFile->getCharStar(globOffset));

        const QLatin1StringView mimeType(cacheFile->getCharStar(mimeTypeOffset));
        //qDebug() << pattern << mimeType << weight << caseSensitive;
        if (isMimeTypeGlobsExcluded(mimeType))
            continue;

        QMimeGlobPattern glob(pattern, QString() /*unused*/, weight, qtCaseSensitive);
        if (glob.matchFileName(fileName)) {
            result.addMatch(mimeType, weight, pattern);
            ++numMatches;
        }
    }
    return numMatches;
}